

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int stb_vorbis_decode_memory(uint8 *mem,int len,int *channels,int *sample_rate,short **output)

{
  int iVar1;
  stb_vorbis *f;
  short *psVar2;
  short *__ptr;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int error;
  
  f = stb_vorbis_open_memory(mem,len,&error,(stb_vorbis_alloc *)0x0);
  if (f == (stb_vorbis *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = f->channels;
    *channels = iVar5;
    uVar6 = (long)iVar5 << 0xc;
    if (sample_rate != (int *)0x0) {
      *sample_rate = f->sample_rate;
    }
    psVar2 = (short *)malloc((long)iVar5 * 0x2000);
    iVar5 = -2;
    if (psVar2 != (short *)0x0) {
      iVar7 = 0;
      uVar4 = uVar6 & 0xffffffff;
      iVar5 = 0;
      do {
        do {
          __ptr = psVar2;
          iVar3 = (int)uVar4;
          iVar1 = stb_vorbis_get_frame_short_interleaved(f,f->channels,__ptr + iVar7,iVar3 - iVar7);
          if (iVar1 == 0) {
            *output = __ptr;
            goto LAB_0015eb00;
          }
          iVar5 = iVar5 + iVar1;
          iVar7 = iVar7 + f->channels * iVar1;
          psVar2 = __ptr;
        } while ((int)uVar6 + iVar7 <= iVar3);
        uVar4 = (ulong)(uint)(iVar3 * 2);
        psVar2 = (short *)realloc(__ptr,(long)(iVar3 * 2) * 2);
      } while (psVar2 != (short *)0x0);
      free(__ptr);
      iVar5 = -2;
    }
LAB_0015eb00:
    stb_vorbis_close(f);
  }
  return iVar5;
}

Assistant:

int stb_vorbis_decode_memory(const uint8 *mem, int len, int *channels, int *sample_rate, short **output)
{
   int data_len, offset, total, limit, error;
   short *data;
   stb_vorbis *v = stb_vorbis_open_memory(mem, len, &error, NULL);
   if (v == NULL) return -1;
   limit = v->channels * 4096;
   *channels = v->channels;
   if (sample_rate)
      *sample_rate = v->sample_rate;
   offset = data_len = 0;
   total = limit;
   data = (short *) malloc(total * sizeof(*data));
   if (data == NULL) {
      stb_vorbis_close(v);
      return -2;
   }
   for (;;) {
      int n = stb_vorbis_get_frame_short_interleaved(v, v->channels, data+offset, total-offset);
      if (n == 0) break;
      data_len += n;
      offset += n * v->channels;
      if (offset + limit > total) {
         short *data2;
         total *= 2;
         data2 = (short *) realloc(data, total * sizeof(*data));
         if (data2 == NULL) {
            free(data);
            stb_vorbis_close(v);
            return -2;
         }
         data = data2;
      }
   }
   *output = data;
   stb_vorbis_close(v);
   return data_len;
}